

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_elf32i386.c
# Opt level: O0

void aros_writeexec(GlobalVars *gv,FILE *f)

{
  long in_RDI;
  LinkedSection *ls;
  _func_uint8_t_Reloc_ptr *in_stack_00000028;
  int8_t in_stack_00000035;
  uint16_t in_stack_00000036;
  FILE *in_stack_00000038;
  GlobalVars *in_stack_00000040;
  long *local_18;
  
  for (local_18 = *(long **)(in_RDI + 0x1d8); *local_18 != 0; local_18 = (long *)*local_18) {
    if ((*(byte *)((long)local_18 + 0x21) & 2) == 0) {
      local_18[0xb] = local_18[10];
    }
  }
  elf32_writeobject(in_stack_00000040,in_stack_00000038,in_stack_00000036,in_stack_00000035,
                    in_stack_00000028);
  return;
}

Assistant:

static void aros_writeexec(struct GlobalVars *gv,FILE *f)
/* creates a target-elfaros executable file, which in reality */
/* is a relocatable object too, but all symbol references have */
/* been resolved */
{
  struct LinkedSection *ls;

  for (ls=(struct LinkedSection *)gv->lnksec.first; ls->n.next!=NULL;
       ls=(struct LinkedSection *)ls->n.next) {
    /* set filesize to memsize for all sections */
    if (!(ls->flags & SF_UNINITIALIZED))
      ls->filesize = ls->size;
  }

  elf32_writeobject(gv,f,EM_386,_LITTLE_ENDIAN_,i386_reloc_vlink2elf);
}